

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoped_ptr.h
# Opt level: O3

void __thiscall
MeCab::scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::~scoped_ptr(scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  pointer pcVar2;
  
  this->_vptr_scoped_ptr = (_func_int **)&PTR__scoped_ptr_0019be18;
  pbVar1 = this->ptr_;
  if ((pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     (pcVar2 = (pbVar1->_M_dataplus)._M_p,
     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)pcVar2 != &pbVar1->field_2)) {
    operator_delete(pcVar2);
  }
  operator_delete(pbVar1);
  return;
}

Assistant:

virtual ~scoped_ptr() { delete ptr_; }